

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

float units::detail::cround(float val)

{
  uint32_t bits;
  float val_local;
  
  return (float)((int)val + 8U & 0xfffffff0);
}

Assistant:

inline float cround(float val)
    {
#ifdef UNITS_NO_IEEE754
        int exp;
        auto f = frexpf(val, &exp);
        f = roundf(f * 1e6F);
        return ldexpf(f * 1e-6F, exp);
#else
        // what this is doing is assuming IEEE 754 floating point definition
        // taking 20 bits out of 24(roughly 10^6), adding 8 first 0b1000 to do
        // rounding using memcpy to abide by strict aliasing rules based on
        // godbolt.org this gets compiled to 2 instructions + the register loads
        std::uint32_t bits{0};
        std::memcpy(&bits, &val, sizeof(bits));
        bits += 8UL;
        bits &= 0xFFFFFFF0UL;
        std::memcpy(&val, &bits, sizeof(bits));
        return val;
#endif
    }